

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_cgreen_pipe.c
# Opt level: O0

ssize_t cgreen_pipe_write(int p,void *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  int status;
  int pipe_write_result;
  undefined1 local_20 [4];
  int local_1c;
  
  sVar1 = write(in_EDI,in_RSI,in_RDX);
  local_1c = (int)sVar1;
  if (local_1c < 0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xb) {
      panic("src/posix_cgreen_pipe.c",0x3f,"Too many assertions within a single test.");
    }
    piVar2 = __errno_location();
    if (*piVar2 != 0x20) {
      panic("src/posix_cgreen_pipe.c",0x41,
            "Error when reporting from test case process to reporter.");
    }
    raise(0xd);
    wait(local_20);
  }
  return (long)local_1c;
}

Assistant:

ssize_t cgreen_pipe_write(int p, const void *buf, size_t count)
{
    int pipe_write_result = write(p, buf, count);
    int status;
    if (pipe_write_result < 0) {
        if (errno == EWOULDBLOCK) {
            PANIC("Too many assertions within a single test.");
        } else if (errno != EPIPE) {
            PANIC("Error when reporting from test case process to reporter.");
        }
        raise(SIGPIPE);
        wait(&status); /* Safe-guarding against a signalhandler for SIGPIPE, which
                          incidentally the test case for pipe block need to have... */
    }
    return pipe_write_result;
}